

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O3

void __thiscall
Tree::BuildUnitImpl(Tree *this,cmXMLWriter *xml,string *virtualFolderPath,string *fsPath)

{
  Tree *pTVar1;
  _Base_ptr p_Var2;
  pointer this_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  string local_f0;
  string local_d0;
  pointer local_b0;
  undefined8 local_a8;
  size_type local_a0;
  char *local_98;
  undefined8 local_90;
  _Base_ptr local_88;
  char *local_80;
  undefined8 local_78;
  Tree *local_70;
  string *local_68;
  string *local_60;
  pointer local_58;
  string local_50;
  
  p_Var2 = (this->files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_70 = (Tree *)&(this->files)._M_t._M_impl.super__Rb_tree_header;
  local_68 = virtualFolderPath;
  local_60 = fsPath;
  if ((Tree *)p_Var2 != local_70) {
    do {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Unit","");
      cmXMLWriter::StartElement(xml,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      local_d0._M_string_length = (size_type)(local_60->_M_dataplus)._M_p;
      local_d0._M_dataplus._M_p = (pointer)local_60->_M_string_length;
      local_d0.field_2._M_allocated_capacity = 0;
      local_b0 = (this->path)._M_dataplus._M_p;
      local_d0.field_2._8_8_ = (this->path)._M_string_length;
      local_a8 = 0;
      local_a0 = 1;
      local_98 = "/";
      local_90 = 0;
      local_80 = *(char **)(p_Var2 + 1);
      local_88 = p_Var2[1]._M_parent;
      local_78 = 0;
      views._M_len = 4;
      views._M_array = (iterator)&local_d0;
      cmCatViews(&local_f0,views);
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,"filename",&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Option","");
      cmXMLWriter::StartElement(xml,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      local_d0._M_dataplus._M_p = (pointer)0xc;
      local_d0._M_string_length = 0x8c9e66;
      local_d0.field_2._M_allocated_capacity = 0;
      local_b0 = (local_68->_M_dataplus)._M_p;
      local_d0.field_2._8_8_ = local_68->_M_string_length;
      local_a8 = 0;
      local_98 = (this->path)._M_dataplus._M_p;
      local_a0 = (this->path)._M_string_length;
      local_90 = 0;
      local_88 = (_Base_ptr)0x1;
      local_80 = "\\";
      local_78 = 0;
      views_00._M_len = 4;
      views_00._M_array = (iterator)&local_d0;
      cmCatViews(&local_f0,views_00);
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,"virtualFolder",&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      cmXMLWriter::EndElement(xml);
      cmXMLWriter::EndElement(xml);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((Tree *)p_Var2 != local_70);
  }
  this_00 = (this->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_58 = (this->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (this_00 != local_58) {
    local_70 = this;
    do {
      pTVar1 = local_70;
      local_d0._M_string_length = (size_type)(local_68->_M_dataplus)._M_p;
      local_d0._M_dataplus._M_p = (pointer)local_68->_M_string_length;
      local_d0.field_2._M_allocated_capacity = 0;
      local_b0 = (local_70->path)._M_dataplus._M_p;
      local_d0.field_2._8_8_ = (local_70->path)._M_string_length;
      local_a8 = 0;
      local_a0 = 1;
      local_98 = "\\";
      local_90 = 0;
      views_01._M_len = 3;
      views_01._M_array = (iterator)&local_d0;
      cmCatViews(&local_f0,views_01);
      local_d0._M_string_length = (size_type)(local_60->_M_dataplus)._M_p;
      local_d0._M_dataplus._M_p = (pointer)local_60->_M_string_length;
      local_d0.field_2._M_allocated_capacity = 0;
      local_b0 = (pTVar1->path)._M_dataplus._M_p;
      local_d0.field_2._8_8_ = (pTVar1->path)._M_string_length;
      local_a8 = 0;
      local_a0 = 1;
      local_98 = "/";
      local_90 = 0;
      views_02._M_len = 3;
      views_02._M_array = (iterator)&local_d0;
      cmCatViews(&local_50,views_02);
      BuildUnitImpl(this_00,xml,&local_f0,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      this_00 = this_00 + 1;
    } while (this_00 != local_58);
  }
  return;
}

Assistant:

void Tree::BuildUnitImpl(cmXMLWriter& xml,
                         const std::string& virtualFolderPath,
                         const std::string& fsPath) const
{
  for (std::string const& f : this->files) {
    xml.StartElement("Unit");
    xml.Attribute("filename", cmStrCat(fsPath, this->path, "/", f));

    xml.StartElement("Option");
    xml.Attribute(
      "virtualFolder",
      cmStrCat("CMake Files\\", virtualFolderPath, this->path, "\\"));
    xml.EndElement();

    xml.EndElement();
  }
  for (Tree const& folder : this->folders) {
    folder.BuildUnitImpl(xml, cmStrCat(virtualFolderPath, this->path, "\\"),
                         cmStrCat(fsPath, this->path, "/"));
  }
}